

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridLocalPolynomial.hpp
# Opt level: O3

void __thiscall
TasGrid::GridLocalPolynomial::diffBasisSupported<(TasGrid::RuleLocal::erule)4>
          (GridLocalPolynomial *this,int *point,double *x,double *diff_values,bool *isSupported)

{
  int iVar1;
  uint uVar2;
  undefined1 auVar3 [16];
  double *pdVar4;
  bool bVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  double dVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  bool isDimSupported;
  bool local_39;
  double *local_38;
  
  *isSupported = false;
  auVar3 = _DAT_001ca060;
  iVar1 = (this->super_BaseCanonicalGrid).num_dimensions;
  if (0 < (long)iVar1) {
    lVar9 = (long)iVar1 + -1;
    auVar11._8_4_ = (int)lVar9;
    auVar11._0_8_ = lVar9;
    auVar11._12_4_ = (int)((ulong)lVar9 >> 0x20);
    lVar9 = 0;
    auVar11 = auVar11 ^ _DAT_001ca060;
    auVar12 = _DAT_001ca070;
    do {
      auVar13 = auVar12 ^ auVar3;
      if ((bool)(~(auVar13._4_4_ == auVar11._4_4_ && auVar11._0_4_ < auVar13._0_4_ ||
                  auVar11._4_4_ < auVar13._4_4_) & 1)) {
        *(undefined8 *)((long)diff_values + lVar9) = 0x3ff0000000000000;
      }
      if ((auVar13._12_4_ != auVar11._12_4_ || auVar13._8_4_ <= auVar11._8_4_) &&
          auVar13._12_4_ <= auVar11._12_4_) {
        *(undefined8 *)((long)diff_values + lVar9 + 8) = 0x3ff0000000000000;
      }
      lVar6 = auVar12._8_8_;
      auVar12._0_8_ = auVar12._0_8_ + 2;
      auVar12._8_8_ = lVar6 + 2;
      lVar9 = lVar9 + 0x10;
    } while ((ulong)(iVar1 + 1U >> 1) << 4 != lVar9);
    local_39 = false;
    if (0 < iVar1) {
      uVar8 = 1;
      lVar9 = 0;
      local_38 = x;
      do {
        dVar10 = RuleLocal::evalSupport<(TasGrid::RuleLocal::erule)4>
                           (this->order,point[lVar9],local_38[lVar9],&local_39);
        pdVar4 = local_38;
        bVar5 = *isSupported;
        if (local_39 != false) {
          bVar5 = true;
        }
        *isSupported = bVar5;
        if (lVar9 != 0) {
          lVar6 = 0;
          do {
            diff_values[lVar6] = diff_values[lVar6] * dVar10;
            lVar6 = lVar6 + 1;
          } while (lVar9 != lVar6);
        }
        lVar9 = lVar9 + 1;
        uVar2 = (this->super_BaseCanonicalGrid).num_dimensions;
        if ((int)uVar2 <= lVar9) break;
        uVar7 = uVar8;
        do {
          diff_values[uVar7] = diff_values[uVar7] * dVar10;
          uVar7 = uVar7 + 1;
        } while (uVar2 != uVar7);
        uVar8 = uVar8 + 1;
      } while (lVar9 < (int)uVar2);
      if (0 < (int)uVar2) {
        lVar9 = 0;
        do {
          dVar10 = RuleLocal::diffSupport<(TasGrid::RuleLocal::erule)4>
                             (this->order,point[lVar9],pdVar4[lVar9],&local_39);
          diff_values[lVar9] = dVar10 * diff_values[lVar9];
          bVar5 = *isSupported;
          if (local_39 != false) {
            bVar5 = true;
          }
          *isSupported = bVar5;
          lVar9 = lVar9 + 1;
        } while (lVar9 < (this->super_BaseCanonicalGrid).num_dimensions);
      }
    }
  }
  return;
}

Assistant:

void diffBasisSupported(const int point[], const double x[], double diff_values[], bool &isSupported) const{
        isSupported = false;
        for(int i=0; i<num_dimensions; i++) diff_values[i] = 1.0;
        bool isDimSupported = false;
        for(int k=0; k<num_dimensions; k++) {
            double fval = RuleLocal::evalSupport<effrule>(order, point[k], x[k], isDimSupported);
            isSupported = isDimSupported or isSupported;
            for(int j=0; j<k; j++) diff_values[j] *= fval;
            for(int j=k+1; j<num_dimensions; j++) diff_values[j] *= fval;
        }
        for (int k=0; k<num_dimensions; k++) {
            diff_values[k] *= RuleLocal::diffSupport<effrule>(order, point[k], x[k], isDimSupported);
            isSupported = isDimSupported or isSupported;
        }
    }